

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildMultiplyRectAlpha8
               (uchar *table,uchar *pixels,int x,int y,int w,int h,int stride)

{
  bool bVar1;
  uchar *puVar2;
  ulong uVar3;
  int j;
  
  if (0 < h) {
    puVar2 = pixels + (long)(y * stride) + (long)x;
    do {
      if (0 < w) {
        uVar3 = 0;
        do {
          puVar2[uVar3] = table[puVar2[uVar3]];
          uVar3 = uVar3 + 1;
        } while ((uint)w != uVar3);
      }
      puVar2 = puVar2 + stride;
      bVar1 = 1 < h;
      h = h + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void    ImFontAtlasBuildMultiplyRectAlpha8(const unsigned char table[256], unsigned char* pixels, int x, int y, int w, int h, int stride)
{
    unsigned char* data = pixels + x + y * stride;
    for (int j = h; j > 0; j--, data += stride)
        for (int i = 0; i < w; i++)
            data[i] = table[data[i]];
}